

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTaggerValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)2001>(Result *__return_storage_ptr__,Model *format)

{
  BayesianProbitRegressor *pBVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Type *pTVar10;
  ostream *poVar11;
  char *pcVar12;
  int index;
  Result *this;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  undefined1 *puVar13;
  bool bVar14;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  allocator_type local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  int local_20c;
  int local_208;
  int local_204;
  RepeatedPtrFieldBase *local_200;
  int local_1f8;
  TypeCase local_1f4;
  Result result;
  string name;
  
  puVar13 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar13 == (ModelDescription *)0x0) {
    puVar13 = Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] == 0x7d1) {
    pBVar1 = (format->Type_).bayesianprobitregressor_;
    uVar2._0_4_ = (pBVar1->features_).super_RepeatedPtrFieldBase.current_size_;
    uVar2._4_4_ = (pBVar1->features_).super_RepeatedPtrFieldBase.total_size_;
    bVar14 = *(long *)(((ulong)(pBVar1->features_).super_RepeatedPtrFieldBase.rep_ &
                       0xfffffffffffffffe) + 8) != 0;
    uVar5 = bVar14 + 1;
    if (*(long *)((uVar2 & 0xfffffffffffffffe) + 8) == 0) {
      uVar5 = (uint)bVar14;
    }
    iVar6 = ((uVar5 - (*(long *)(((ulong)(pBVar1->regressioninputfeaturename_).tagged_ptr_.ptr_ &
                                 0xfffffffffffffffe) + 8) == 0)) + 2) -
            (uint)(*(long *)(((ulong)(pBVar1->optimisminputfeaturename_).tagged_ptr_.ptr_ &
                             0xfffffffffffffffe) + 8) == 0);
    if ((((ModelDescription *)puVar13)->output_).super_RepeatedPtrFieldBase.current_size_ == iVar6)
    {
      local_200 = &(((ModelDescription *)puVar13)->output_).super_RepeatedPtrFieldBase;
      iVar7 = -1;
      local_20c = -1;
      local_208 = local_20c;
      local_204 = local_20c;
      for (index = 0; index < iVar6; index = index + 1) {
        local_1f8 = iVar7;
        pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                            (local_200,index);
        std::__cxx11::string::string
                  ((string *)&name,
                   (string *)((ulong)(pTVar10->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        uVar3._0_4_ = (pBVar1->features_).super_RepeatedPtrFieldBase.current_size_;
        uVar3._4_4_ = (pBVar1->features_).super_RepeatedPtrFieldBase.total_size_;
        iVar6 = std::__cxx11::string::compare((string *)(uVar3 & 0xfffffffffffffffe));
        if (iVar6 == 0) {
          local_20c = index;
        }
        iVar7 = std::__cxx11::string::compare
                          ((string *)
                           ((ulong)(pBVar1->features_).super_RepeatedPtrFieldBase.rep_ &
                           0xfffffffffffffffe));
        if (iVar7 == 0) {
          local_208 = index;
        }
        iVar8 = std::__cxx11::string::compare
                          ((string *)
                           ((ulong)(pBVar1->regressioninputfeaturename_).tagged_ptr_.ptr_ &
                           0xfffffffffffffffe));
        if (iVar8 == 0) {
          local_204 = index;
        }
        iVar9 = std::__cxx11::string::compare
                          ((string *)
                           ((ulong)(pBVar1->optimisminputfeaturename_).tagged_ptr_.ptr_ &
                           0xfffffffffffffffe));
        if ((((iVar6 != 0) && (iVar7 != 0)) && (iVar8 != 0)) && (iVar9 != 0)) {
          std::operator+(&local_230,"Output feature \'",&name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &result,&local_230,
                         "\' was not required by the output features of the word tagger model.");
          Result::Result(__return_storage_ptr__,TOO_MANY_FEATURES_FOR_MODEL_TYPE,(string *)&result);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::~string((string *)&local_230);
          goto LAB_0028867e;
        }
        iVar7 = local_1f8;
        if (iVar9 == 0) {
          iVar7 = index;
        }
        std::__cxx11::string::~string((string *)&name);
        iVar6 = (((ModelDescription *)puVar13)->output_).super_RepeatedPtrFieldBase.current_size_;
      }
      if (local_208 == -1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       "Expected feature \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(pBVar1->features_).super_RepeatedPtrFieldBase.rep_ &
                       0xfffffffffffffffe));
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &result,
                       "\' (defined by tokenTagsOutputFeatureName) to the model is not present in the model description."
                      );
        Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,&name);
        std::__cxx11::string::~string((string *)&name);
        this = &result;
        goto LAB_00288686;
      }
      Result::Result(&result);
      local_1f4 = kStringType;
      __l._M_len = 1;
      __l._M_array = &local_1f4;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)&local_230,__l,&local_231);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)&name,(CoreML *)&((ModelDescription *)puVar13)->input_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_230,
                 in_R8);
      Result::operator=(&result,(Result *)&name);
      std::__cxx11::string::~string((string *)&name._M_string_length);
      std::
      _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                       *)&local_230);
      bVar14 = Result::good(&result);
      if (bVar14) {
        uVar5 = (((ModelDescription *)puVar13)->output_).super_RepeatedPtrFieldBase.current_size_;
        local_1f4 = kSequenceType;
        __l_00._M_len = 1;
        __l_00._M_array = &local_1f4;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  *)&local_230,__l_00,&local_231);
        validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                  ((Result *)&name,(CoreML *)local_200,
                   (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(ulong)uVar5,
                   (int)&local_230,in_R8);
        Result::operator=(&result,(Result *)&name);
        std::__cxx11::string::~string((string *)&name._M_string_length);
        std::
        _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                         *)&local_230);
        bVar14 = Result::good(&result);
        iVar6 = local_204;
        if (!bVar14) goto LAB_00288a35;
        pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                            (local_200,local_208);
        puVar13 = (undefined1 *)pTVar10->type_;
        if ((FeatureType *)puVar13 == (FeatureType *)0x0) {
          puVar13 = Specification::_FeatureType_default_instance_;
        }
        if (((FeatureType *)puVar13)->_oneof_case_[0] == 7) {
          puVar13 = (undefined1 *)(((FeatureType *)puVar13)->Type_).sequencetype_;
        }
        else {
          puVar13 = Specification::_SequenceFeatureType_default_instance_;
        }
        if (((SequenceFeatureType *)puVar13)->_oneof_case_[0] == 3) {
          if (local_20c != -1) {
            pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                (local_200,local_20c);
            puVar13 = (undefined1 *)pTVar10->type_;
            if ((FeatureType *)puVar13 == (FeatureType *)0x0) {
              puVar13 = Specification::_FeatureType_default_instance_;
            }
            if (((FeatureType *)puVar13)->_oneof_case_[0] == 7) {
              puVar13 = (undefined1 *)(((FeatureType *)puVar13)->Type_).sequencetype_;
            }
            else {
              puVar13 = Specification::_SequenceFeatureType_default_instance_;
            }
            if (((SequenceFeatureType *)puVar13)->_oneof_case_[0] != 3) {
              std::__cxx11::stringstream::stringstream((stringstream *)&name);
              poVar11 = std::operator<<((ostream *)name.field_2._M_local_buf,"Unsupported type \"");
              pcVar12 = ::MLFeatureTypeType_Name(((SequenceFeatureType *)puVar13)->_oneof_case_[0]);
              poVar11 = std::operator<<(poVar11,pcVar12);
              poVar11 = std::operator<<(poVar11,"\" for feature \"");
              uVar4._0_4_ = (pBVar1->features_).super_RepeatedPtrFieldBase.current_size_;
              uVar4._4_4_ = (pBVar1->features_).super_RepeatedPtrFieldBase.total_size_;
              std::operator+(&local_230,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (uVar4 & 0xfffffffffffffffe),"\". Should be: ");
              poVar11 = std::operator<<(poVar11,(string *)&local_230);
              std::operator<<(poVar11,"MLFeatureTypeType_stringType");
              std::__cxx11::string::~string((string *)&local_230);
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_230);
              goto LAB_00288af6;
            }
          }
          if (iVar6 != -1) {
            pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                (local_200,iVar6);
            puVar13 = (undefined1 *)pTVar10->type_;
            if ((FeatureType *)puVar13 == (FeatureType *)0x0) {
              puVar13 = Specification::_FeatureType_default_instance_;
            }
            if (((FeatureType *)puVar13)->_oneof_case_[0] == 7) {
              puVar13 = (undefined1 *)(((FeatureType *)puVar13)->Type_).sequencetype_;
            }
            else {
              puVar13 = Specification::_SequenceFeatureType_default_instance_;
            }
            if (((SequenceFeatureType *)puVar13)->_oneof_case_[0] != 1) {
              std::__cxx11::stringstream::stringstream((stringstream *)&name);
              poVar11 = std::operator<<((ostream *)name.field_2._M_local_buf,"Unsupported type \"");
              pcVar12 = ::MLFeatureTypeType_Name(((SequenceFeatureType *)puVar13)->_oneof_case_[0]);
              poVar11 = std::operator<<(poVar11,pcVar12);
              poVar11 = std::operator<<(poVar11,"\" for feature \"");
              std::operator+(&local_230,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((ulong)(pBVar1->regressioninputfeaturename_).tagged_ptr_.ptr_ &
                             0xfffffffffffffffe),"\". Should be: ");
              poVar11 = std::operator<<(poVar11,(string *)&local_230);
              std::operator<<(poVar11,"MLFeatureTypeType_int64Type");
              std::__cxx11::string::~string((string *)&local_230);
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_230);
              goto LAB_00288af6;
            }
          }
          if (iVar7 != -1) {
            pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                (local_200,iVar7);
            puVar13 = (undefined1 *)pTVar10->type_;
            if ((FeatureType *)puVar13 == (FeatureType *)0x0) {
              puVar13 = Specification::_FeatureType_default_instance_;
            }
            if (((FeatureType *)puVar13)->_oneof_case_[0] == 7) {
              puVar13 = (undefined1 *)(((FeatureType *)puVar13)->Type_).sequencetype_;
            }
            else {
              puVar13 = Specification::_SequenceFeatureType_default_instance_;
            }
            if (((SequenceFeatureType *)puVar13)->_oneof_case_[0] != 1) {
              std::__cxx11::stringstream::stringstream((stringstream *)&name);
              poVar11 = std::operator<<((ostream *)name.field_2._M_local_buf,"Unsupported type \"");
              pcVar12 = ::MLFeatureTypeType_Name(((SequenceFeatureType *)puVar13)->_oneof_case_[0]);
              poVar11 = std::operator<<(poVar11,pcVar12);
              poVar11 = std::operator<<(poVar11,"\" for feature \"");
              std::operator+(&local_230,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((ulong)(pBVar1->optimisminputfeaturename_).tagged_ptr_.ptr_ &
                             0xfffffffffffffffe),"\". Should be: ");
              poVar11 = std::operator<<(poVar11,(string *)&local_230);
              std::operator<<(poVar11,"MLFeatureTypeType_int64Type");
              std::__cxx11::string::~string((string *)&local_230);
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_230);
              goto LAB_00288af6;
            }
          }
          if (*(int *)&(pBVar1->samplingtruncationinputfeaturename_).tagged_ptr_.ptr_ == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&name,"Model revision number not set. Must be >= 1",
                       (allocator<char> *)&local_230);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&name);
          }
          else {
            iVar6 = *(int *)((long)&(pBVar1->varianceoutputfeaturename_).tagged_ptr_.ptr_ + 4);
            if ((iVar6 == 0) ||
               ((iVar6 == 200 &&
                (*(int *)((long)(pBVar1->meanoutputfeaturename_).tagged_ptr_.ptr_ + 0x18) < 1)))) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&name,"Model output tags not set. Must have at least one tag",
                         (allocator<char> *)&local_230);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&name);
            }
            else {
              if (*(long *)(((ulong)(pBVar1->samplingscaleinputfeaturename_).tagged_ptr_.ptr_ &
                            0xfffffffffffffffe) + 8) != 0) goto LAB_00288a35;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&name,"Model parameter data not set",
                         (allocator<char> *)&local_230);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&name);
            }
          }
          std::__cxx11::string::~string((string *)&name);
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)&name);
          poVar11 = std::operator<<((ostream *)name.field_2._M_local_buf,"Unsupported type \"");
          pcVar12 = ::MLFeatureTypeType_Name(((SequenceFeatureType *)puVar13)->_oneof_case_[0]);
          poVar11 = std::operator<<(poVar11,pcVar12);
          poVar11 = std::operator<<(poVar11,"\" for feature \"");
          std::operator+(&local_230,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(pBVar1->features_).super_RepeatedPtrFieldBase.rep_ &
                         0xfffffffffffffffe),"\". Should be: ");
          poVar11 = std::operator<<(poVar11,(string *)&local_230);
          std::operator<<(poVar11,"MLFeatureTypeType_stringType");
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::stringbuf::str();
          Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_230);
LAB_00288af6:
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::stringstream::~stringstream((stringstream *)&name);
        }
      }
      else {
LAB_00288a35:
        Result::Result(__return_storage_ptr__,&result);
      }
      this = (Result *)&result.m_message;
      goto LAB_00288686;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,
               "More model output features than the output features of the word tagger model.",
               (allocator<char> *)&result);
    Result::Result(__return_storage_ptr__,TOO_MANY_FEATURES_FOR_MODEL_TYPE,&name);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"Model not a word tagger.",(allocator<char> *)&result);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&name);
  }
LAB_0028867e:
  this = (Result *)&name;
LAB_00288686:
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_wordTagger>(const Specification::Model& format) {
        const auto& interface = format.description();
        const auto& inputs = interface.input();
        const auto& outputs = interface.output();
        
        // make sure model is a word tager
        if (!format.has_wordtagger()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a word tagger.");
        }
        
        const auto& wordTagger = format.wordtagger();
        
        int numNonEmptyOutputFeatures = 0;
        
        if (wordTagger.tokentagsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokensoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokenlocationsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokenlengthsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (outputs.size() != numNonEmptyOutputFeatures) {
            return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                          "More model output features than the output features of the word tagger model.");
        }        
        
        int tokensOutputIndex = -1;
        int tokenTagsOutputIndex = -1;
        int tokenLocationsOutputIndex = -1;
        int tokenLengthsOutputIndex = -1;
        
        // check that any interface output can be found from word tagger outputs
        for (int i = 0; i < outputs.size(); i++) {
            const std::string name = outputs[i].name();
            bool present = false;
            
            if (wordTagger.tokensoutputfeaturename().compare(name) == 0) {
                tokensOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokentagsoutputfeaturename().compare(name) == 0) {
                tokenTagsOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokenlocationsoutputfeaturename().compare(name) == 0) {
                tokenLocationsOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokenlengthsoutputfeaturename().compare(name) == 0) {
                tokenLengthsOutputIndex = i;
                present = true;
            }
            
            if (!present) {
                return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                              "Output feature '" + name + "' was not required by the output features of the word tagger model.");
            }
        }
        
        // token tags is the required output feature name, while tokens/locations/lengths are optional
        if (tokenTagsOutputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + wordTagger.tokentagsoutputfeaturename() + "' (defined by tokenTagsOutputFeatureName) to the model is not present in the model description.");
        }
        
        Result result;
        
        // Validate the inputs: only one input with string type is allowed
        result = validateDescriptionsContainFeatureWithTypes(inputs, 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs: only sequence type is allowed for any output
        result = validateDescriptionsContainFeatureWithTypes(outputs, outputs.size(), {Specification::FeatureType::kSequenceType});
        if (!result.good()) {
            return result;
        }
        
        // validate the individual output type, token tags has to be a sequence of strings
        const auto& tokenTagsOutputSequenceType = outputs[tokenTagsOutputIndex].type().sequencetype();
        if (tokenTagsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kStringType) {
            std::stringstream out;
            out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenTagsOutputSequenceType.Type_case()))
            << "\" for feature \"" << wordTagger.tokentagsoutputfeaturename() + "\". Should be: "
            << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kStringType));
            
            return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
        }

        // validate the individual output type, tokens (if present) has to be a sequence of strings
        if (tokensOutputIndex != -1) {
            const auto& tokensOutputSequenceType = outputs[tokensOutputIndex].type().sequencetype();
            if (tokensOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kStringType) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokensOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokensoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kStringType));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // validate the individual output type, token locations (if present) has to be a sequence of integers
        if (tokenLocationsOutputIndex != -1) {
            const auto& tokenLocationsOutputSequenceType = outputs[tokenLocationsOutputIndex].type().sequencetype();
            if (tokenLocationsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kInt64Type) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenLocationsOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokenlocationsoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kInt64Type));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // validate the individual output type, token lengths (if present) has to be a sequence of integers
        if (tokenLengthsOutputIndex != -1) {
            const auto& tokenLengthsOutputSequenceType = outputs[tokenLengthsOutputIndex].type().sequencetype();
            if (tokenLengthsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kInt64Type) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenLengthsOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokenlengthsoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kInt64Type));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // Validate the model parameters
        if (wordTagger.revision() == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model revision number not set. Must be >= 1");
        }

        int numTags;
        switch (wordTagger.Tags_case()) {
            case Specification::CoreMLModels::WordTagger::kStringTags:
                numTags = wordTagger.stringtags().vector_size();
                break;
            case Specification::CoreMLModels::WordTagger::TAGS_NOT_SET:
                numTags = -1;
                break;
        }
        
        if (numTags <= 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model output tags not set. Must have at least one tag");
        }
        
        if (wordTagger.modelparameterdata().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model parameter data not set");
        }
        
        return result;
    }